

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqltablemodel.cpp
# Opt level: O2

int __thiscall QSqlTableModel::rowCount(QSqlTableModel *this,QModelIndex *parent)

{
  QSqlTableModelPrivate *this_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  long in_FS_OFFSET;
  QModelIndex local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QSqlTableModelPrivate **)&(this->super_QSqlQueryModel).field_0x8;
  bVar1 = QModelIndex::isValid(parent);
  iVar3 = 0;
  if (!bVar1) {
    local_38.r = -1;
    local_38.c = -1;
    local_38.i = 0;
    local_38.m.ptr = (QAbstractItemModel *)0x0;
    iVar2 = QSqlQueryModel::rowCount(&this->super_QSqlQueryModel,&local_38);
    iVar3 = QSqlTableModelPrivate::insertCount(this_00,-1);
    iVar3 = iVar3 + iVar2;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return iVar3;
  }
  __stack_chk_fail();
}

Assistant:

int QSqlTableModel::rowCount(const QModelIndex &parent) const
{
    Q_D(const QSqlTableModel);

    if (parent.isValid())
        return 0;

    return QSqlQueryModel::rowCount() + d->insertCount();
}